

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_table_add_union_vector
              (flatcc_builder_t *B,int id,flatcc_builder_union_vec_ref_t uvref)

{
  flatcc_builder_ref_t *pfVar1;
  int iVar2;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x61f,
                  "int flatcc_builder_table_add_union_vector(flatcc_builder_t *, int, flatcc_builder_union_vec_ref_t)"
                 );
  }
  iVar2 = uvref.type;
  if (((ulong)uvref >> 0x20 != 0) == (iVar2 == 0)) {
    __assert_fail("(uvref.type == 0) == (uvref.value == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x620,
                  "int flatcc_builder_table_add_union_vector(flatcc_builder_t *, int, flatcc_builder_union_vec_ref_t)"
                 );
  }
  if (iVar2 != 0) {
    pfVar1 = flatcc_builder_table_add_offset(B,id + -1);
    if (pfVar1 == (flatcc_builder_ref_t *)0x0) {
      __assert_fail("pref != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x623,
                    "int flatcc_builder_table_add_union_vector(flatcc_builder_t *, int, flatcc_builder_union_vec_ref_t)"
                   );
    }
    *pfVar1 = iVar2;
    pfVar1 = flatcc_builder_table_add_offset(B,id);
    if (pfVar1 == (flatcc_builder_ref_t *)0x0) {
      __assert_fail("pref != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x627,
                    "int flatcc_builder_table_add_union_vector(flatcc_builder_t *, int, flatcc_builder_union_vec_ref_t)"
                   );
    }
    *pfVar1 = uvref.value;
  }
  return 0;
}

Assistant:

int flatcc_builder_table_add_union_vector(flatcc_builder_t *B, int id,
        flatcc_builder_union_vec_ref_t uvref)
{
    flatcc_builder_ref_t *pref;

    check(frame(type) == flatcc_builder_table, "expected table frame");
    check_error((uvref.type == 0) == (uvref.value == 0), -1, "expected both type and value vector, or neither");
    if (uvref.type != 0) {
        pref = flatcc_builder_table_add_offset(B, id - 1);
        check_error(pref != 0, -1, "unable to add union member");
        *pref = uvref.type;

        pref = flatcc_builder_table_add_offset(B, id);
        check_error(pref != 0, -1, "unable to add union member");
        *pref = uvref.value;
    }
    return 0;
}